

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_glfw.cpp
# Opt level: O1

void ImGui_ImplGlfw_UpdateMonitors(void)

{
  ImVec2 *pIVar1;
  int iVar2;
  ImGuiPlatformMonitor *pIVar3;
  ImGuiPlatformIO *pIVar4;
  GLFWmonitor **ppGVar5;
  ImGuiPlatformMonitor *pIVar6;
  GLFWvidmode *pGVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  float fVar13;
  int y;
  int x;
  int monitors_count;
  float x_scale;
  int h;
  int w;
  float y_scale;
  uint local_c8;
  uint local_c4;
  int local_c0;
  float local_bc;
  float local_b8;
  uint local_b4;
  uint local_b0;
  float local_ac;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined8 local_48;
  undefined8 uStack_40;
  
  pIVar4 = ImGui::GetPlatformIO();
  local_c0 = 0;
  ppGVar5 = glfwGetMonitors(&local_c0);
  iVar12 = (pIVar4->Monitors).Capacity;
  if (iVar12 < 0) {
    uVar8 = iVar12 / 2 + iVar12;
    uVar11 = 0;
    if (0 < (int)uVar8) {
      uVar11 = (ulong)uVar8;
    }
    pIVar6 = (ImGuiPlatformMonitor *)ImGui::MemAlloc(uVar11 * 0x24);
    pIVar3 = (pIVar4->Monitors).Data;
    if (pIVar3 != (ImGuiPlatformMonitor *)0x0) {
      memcpy(pIVar6,pIVar3,(long)(pIVar4->Monitors).Size * 0x24);
      ImGui::MemFree((pIVar4->Monitors).Data);
    }
    (pIVar4->Monitors).Data = pIVar6;
    (pIVar4->Monitors).Capacity = (int)uVar11;
  }
  (pIVar4->Monitors).Size = 0;
  if (0 < local_c0) {
    lVar10 = 0;
    do {
      glfwGetMonitorPos(ppGVar5[lVar10],(int *)&local_c4,(int *)&local_c8);
      pGVar7 = glfwGetVideoMode(ppGVar5[lVar10]);
      local_48._0_4_ = pGVar7->width;
      local_48._4_4_ = pGVar7->height;
      uStack_40 = 0;
      local_68 = ZEXT416(local_c8);
      local_58 = ZEXT416(local_c4);
      glfwGetMonitorWorkarea
                (ppGVar5[lVar10],(int *)&local_c4,(int *)&local_c8,(int *)&local_b0,(int *)&local_b4
                );
      local_98 = ZEXT416(local_b4);
      local_78 = ZEXT416(local_b0);
      local_a8 = ZEXT416(local_c8);
      local_88 = ZEXT416(local_c4);
      glfwGetMonitorContentScale(ppGVar5[lVar10],&local_b8,&local_ac);
      iVar12 = (pIVar4->Monitors).Size;
      iVar2 = (pIVar4->Monitors).Capacity;
      fVar13 = local_b8;
      if (iVar12 == iVar2) {
        if (iVar2 == 0) {
          iVar9 = 8;
        }
        else {
          iVar9 = iVar2 / 2 + iVar2;
        }
        iVar12 = iVar12 + 1;
        if (iVar12 < iVar9) {
          iVar12 = iVar9;
        }
        if (iVar2 < iVar12) {
          local_bc = local_b8;
          pIVar6 = (ImGuiPlatformMonitor *)ImGui::MemAlloc((long)iVar12 * 0x24);
          pIVar3 = (pIVar4->Monitors).Data;
          if (pIVar3 != (ImGuiPlatformMonitor *)0x0) {
            memcpy(pIVar6,pIVar3,(long)(pIVar4->Monitors).Size * 0x24);
            ImGui::MemFree((pIVar4->Monitors).Data);
          }
          (pIVar4->Monitors).Data = pIVar6;
          (pIVar4->Monitors).Capacity = iVar12;
          fVar13 = local_bc;
        }
      }
      pIVar6 = (pIVar4->Monitors).Data;
      iVar12 = (pIVar4->Monitors).Size;
      pIVar3 = pIVar6 + iVar12;
      (pIVar3->MainPos).x = (float)(int)local_58._0_4_;
      (pIVar3->MainPos).y = (float)(int)local_68._0_4_;
      (pIVar3->MainSize).x = (float)(int)local_48;
      (pIVar3->MainSize).y = (float)(int)((ulong)local_48 >> 0x20);
      pIVar1 = &pIVar6[iVar12].WorkPos;
      pIVar1->x = (float)(int)local_88._0_4_;
      pIVar1->y = (float)(int)local_a8._0_4_;
      pIVar1[1].x = (float)(int)local_78._0_4_;
      pIVar1[1].y = (float)(int)local_98._0_4_;
      pIVar6[iVar12].DpiScale = fVar13;
      (pIVar4->Monitors).Size = (pIVar4->Monitors).Size + 1;
      lVar10 = lVar10 + 1;
    } while (lVar10 < local_c0);
  }
  g_WantUpdateMonitors = 1;
  return;
}

Assistant:

static void ImGui_ImplGlfw_UpdateMonitors()
{
    ImGuiPlatformIO& platform_io = ImGui::GetPlatformIO();
    int monitors_count = 0;
    GLFWmonitor** glfw_monitors = glfwGetMonitors(&monitors_count);
    platform_io.Monitors.resize(0);
    for (int n = 0; n < monitors_count; n++)
    {
        ImGuiPlatformMonitor monitor;
        int x, y;
        glfwGetMonitorPos(glfw_monitors[n], &x, &y);
        const GLFWvidmode* vid_mode = glfwGetVideoMode(glfw_monitors[n]);
#if GLFW_HAS_MONITOR_WORK_AREA
        monitor.MainPos = ImVec2((float)x, (float)y);
        monitor.MainSize = ImVec2((float)vid_mode->width, (float)vid_mode->height);
        int w, h;
        glfwGetMonitorWorkarea(glfw_monitors[n], &x, &y, &w, &h);
        monitor.WorkPos = ImVec2((float)x, (float)y);;
        monitor.WorkSize = ImVec2((float)w, (float)h);
#else
        monitor.MainPos = monitor.WorkPos = ImVec2((float)x, (float)y);
        monitor.MainSize = monitor.WorkSize = ImVec2((float)vid_mode->width, (float)vid_mode->height);
#endif
#if GLFW_HAS_PER_MONITOR_DPI
        // Warning: the validity of monitor DPI information on Windows depends on the application DPI awareness settings, which generally needs to be set in the manifest or at runtime.
        float x_scale, y_scale;
        glfwGetMonitorContentScale(glfw_monitors[n], &x_scale, &y_scale);
        monitor.DpiScale = x_scale;
#endif
        platform_io.Monitors.push_back(monitor);
    }
    g_WantUpdateMonitors = false;
}